

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

string * __thiscall
libtorrent::block_finished_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,block_finished_alert *this)

{
  uint uVar1;
  undefined8 uVar2;
  allocator<char> local_115 [13];
  string local_108;
  char local_e8 [8];
  char ret [200];
  block_finished_alert *this_local;
  
  peer_alert::message_abi_cxx11_(&local_108,&this->super_peer_alert);
  uVar2 = std::__cxx11::string::c_str();
  uVar1 = libtorrent::aux::strong_typedef::operator_cast_to_int
                    ((strong_typedef *)&this->piece_index);
  snprintf(local_e8,200,"%s block finished downloading (piece: %d block: %d)",uVar2,(ulong)uVar1,
           (ulong)*(uint *)&(this->super_peer_alert).field_0x9c);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_e8,local_115);
  std::allocator<char>::~allocator(local_115);
  return __return_storage_ptr__;
}

Assistant:

std::string block_finished_alert::message() const
	{
		char ret[200];
		std::snprintf(ret, sizeof(ret), "%s block finished downloading (piece: %d block: %d)"
			, peer_alert::message().c_str(), static_cast<int>(piece_index), block_index);
		return ret;
	}